

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::Swap(RepeatedField<int> *this,RepeatedField<int> *other)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int swap_total_size;
  int swap_current_size;
  int *swap_elements;
  RepeatedField<int> *other_local;
  RepeatedField<int> *this_local;
  
  if (this != other) {
    piVar3 = this->elements_;
    iVar1 = this->current_size_;
    iVar2 = this->total_size_;
    this->elements_ = other->elements_;
    this->current_size_ = other->current_size_;
    this->total_size_ = other->total_size_;
    other->elements_ = piVar3;
    other->current_size_ = iVar1;
    other->total_size_ = iVar2;
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Element* swap_elements     = elements_;
  int      swap_current_size = current_size_;
  int      swap_total_size   = total_size_;

  elements_     = other->elements_;
  current_size_ = other->current_size_;
  total_size_   = other->total_size_;

  other->elements_     = swap_elements;
  other->current_size_ = swap_current_size;
  other->total_size_   = swap_total_size;
}